

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O1

void hdr_base64_decode_block(char *input,uint8_t *output)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = from_base_64((int)*input);
  iVar2 = from_base_64((int)input[1]);
  iVar3 = from_base_64((int)input[2]);
  iVar4 = from_base_64((int)input[3]);
  *output = (byte)((uint)(iVar1 << 0x12) >> 0x10) | (byte)((uint)(iVar2 << 0xc) >> 0x10);
  output[1] = (byte)((uint)(iVar2 << 0xc) >> 8) | (byte)((uint)(iVar3 << 6) >> 8);
  output[2] = (byte)iVar4 | (byte)(iVar3 << 6);
  return;
}

Assistant:

void hdr_base64_decode_block(const char* input, uint8_t* output)
{
    uint32_t _24_bit_value = 0;

    _24_bit_value |= from_base_64(input[0]) << 18;
    _24_bit_value |= from_base_64(input[1]) << 12;
    _24_bit_value |= from_base_64(input[2]) << 6;
    _24_bit_value |= from_base_64(input[3]);

    output[0] = (uint8_t) ((_24_bit_value >> 16) & 0xFF);
    output[1] = (uint8_t) ((_24_bit_value >> 8) & 0xFF);
    output[2] = (uint8_t) ((_24_bit_value) & 0xFF);
}